

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O0

void Gia_ManStaticFanoutTest(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int local_28;
  int local_24;
  int k;
  int i;
  Gia_Obj_t *pFanout;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  Gia_ManStaticFanoutStart(p);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pFanout = Gia_ManObj(p,local_24);
      bVar3 = pFanout != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjPrint(p,pFanout);
    printf("   Fanouts : ");
    for (local_28 = 0; iVar1 = Gia_ObjFanoutNum(p,pFanout), local_28 < iVar1;
        local_28 = local_28 + 1) {
      pObj_00 = Gia_ObjFanout(p,pFanout,local_28);
      uVar2 = Gia_ObjId(p,pObj_00);
      printf("%5d ",(ulong)uVar2);
    }
    printf("\n");
    local_24 = local_24 + 1;
  }
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManStaticFanoutTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanout;
    int i, k;
    Gia_ManStaticFanoutStart( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjPrint( p, pObj );
        printf( "   Fanouts : " );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
            printf( "%5d ", Gia_ObjId(p, pFanout) );
        printf( "\n" );
    }
    Gia_ManStaticFanoutStop( p );
}